

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

string * __thiscall pbrt::RandomSampler::ToString_abi_cxx11_(RandomSampler *this)

{
  string *in_RDI;
  RNG *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<int_const&,int_const&,pbrt::RNG_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string RandomSampler::ToString() const {
    return StringPrintf("[ RandomSampler samplesPerPixel: %d seed: %d rng: %s ]",
                        samplesPerPixel, seed, rng);
}